

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::Descriptor::GetKeyData(KeyData *__return_storage_ptr__,Descriptor *this)

{
  pointer *this_00;
  bool bVar1;
  uint32_t uVar2;
  CfdException *this_01;
  reference pvVar3;
  undefined1 local_a0 [8];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  allocator local_59;
  string local_58;
  uint32_t local_34;
  CfdSourceLocation local_30;
  Descriptor *local_18;
  Descriptor *this_local;
  
  local_18 = this;
  this_local = (Descriptor *)__return_storage_ptr__;
  uVar2 = GetNeedArgumentNum(this);
  if (uVar2 != 0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x89d;
    local_30.funcname = "GetKeyData";
    local_34 = GetNeedArgumentNum(this);
    logger::warn<unsigned_int>(&local_30,"Failed to empty argument. {}",&local_34);
    this_01 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_58,"Failed to empty argument. need argument descriptor.",&local_59);
    CfdException::CfdException(this_01,kCfdIllegalArgumentError,&local_58);
    __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_00 = &key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  GetKeyDataAll((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_a0,this,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  bVar1 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                    ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_a0);
  if (bVar1) {
    KeyData::KeyData(__return_storage_ptr__);
  }
  else {
    pvVar3 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_a0,
                        0);
    KeyData::KeyData(__return_storage_ptr__,pvVar3);
  }
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

KeyData Descriptor::GetKeyData() const {
  if (GetNeedArgumentNum() != 0) {
    warn(CFD_LOG_SOURCE, "Failed to empty argument. {}", GetNeedArgumentNum());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to empty argument. need argument descriptor.");
  }
  std::vector<std::string> list;
  auto key_list = GetKeyDataAll(&list);
  if (key_list.empty()) return KeyData();
  return key_list[0];
}